

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int mbedtls_sha1_finish_ret(mbedtls_sha1_context *ctx,uchar *output)

{
  uchar *data;
  int iVar1;
  uint uVar2;
  
  uVar2 = ctx->total[0] & 0x3f;
  data = ctx->buffer;
  ctx->buffer[uVar2] = 0x80;
  if (uVar2 < 0x38) {
    memset(ctx->buffer + (ulong)uVar2 + 1,0,(ulong)(0x37 - uVar2));
  }
  else {
    memset(ctx->buffer + (ulong)uVar2 + 1,0,(ulong)(uVar2 ^ 0x3f));
    mbedtls_internal_sha1_process(ctx,data);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    ctx->buffer[8] = '\0';
    ctx->buffer[9] = '\0';
    ctx->buffer[10] = '\0';
    ctx->buffer[0xb] = '\0';
    ctx->buffer[0xc] = '\0';
    ctx->buffer[0xd] = '\0';
    ctx->buffer[0xe] = '\0';
    ctx->buffer[0xf] = '\0';
    ctx->buffer[0x10] = '\0';
    ctx->buffer[0x11] = '\0';
    ctx->buffer[0x12] = '\0';
    ctx->buffer[0x13] = '\0';
    ctx->buffer[0x14] = '\0';
    ctx->buffer[0x15] = '\0';
    ctx->buffer[0x16] = '\0';
    ctx->buffer[0x17] = '\0';
    ctx->buffer[0x18] = '\0';
    ctx->buffer[0x19] = '\0';
    ctx->buffer[0x1a] = '\0';
    ctx->buffer[0x1b] = '\0';
    ctx->buffer[0x1c] = '\0';
    ctx->buffer[0x1d] = '\0';
    ctx->buffer[0x1e] = '\0';
    ctx->buffer[0x1f] = '\0';
    ctx->buffer[0x20] = '\0';
    ctx->buffer[0x21] = '\0';
    ctx->buffer[0x22] = '\0';
    ctx->buffer[0x23] = '\0';
    ctx->buffer[0x24] = '\0';
    ctx->buffer[0x25] = '\0';
    ctx->buffer[0x26] = '\0';
    ctx->buffer[0x27] = '\0';
    ctx->buffer[0x28] = '\0';
    ctx->buffer[0x29] = '\0';
    ctx->buffer[0x2a] = '\0';
    ctx->buffer[0x2b] = '\0';
    ctx->buffer[0x2c] = '\0';
    ctx->buffer[0x2d] = '\0';
    ctx->buffer[0x2e] = '\0';
    ctx->buffer[0x2f] = '\0';
    ctx->buffer[0x30] = '\0';
    ctx->buffer[0x31] = '\0';
    ctx->buffer[0x32] = '\0';
    ctx->buffer[0x33] = '\0';
    ctx->buffer[0x34] = '\0';
    ctx->buffer[0x35] = '\0';
    ctx->buffer[0x36] = '\0';
    ctx->buffer[0x37] = '\0';
  }
  uVar2 = ctx->total[0];
  iVar1 = ctx->total[1] << 3;
  ctx->buffer[0x38] = (uchar)((uint)iVar1 >> 0x18);
  ctx->buffer[0x39] = (uchar)((uint)iVar1 >> 0x10);
  ctx->buffer[0x3a] = (uchar)((uint)iVar1 >> 8);
  ctx->buffer[0x3b] = (byte)iVar1 | (byte)(uVar2 >> 0x1d);
  ctx->buffer[0x3c] = (uchar)(uVar2 >> 0x15);
  ctx->buffer[0x3d] = (uchar)(uVar2 >> 0xd);
  ctx->buffer[0x3e] = (uchar)(uVar2 >> 5);
  ctx->buffer[0x3f] = (char)uVar2 * '\b';
  mbedtls_internal_sha1_process(ctx,data);
  *output = *(uchar *)((long)ctx->state + 3);
  output[1] = *(uchar *)((long)ctx->state + 2);
  output[2] = *(uchar *)((long)ctx->state + 1);
  output[3] = (uchar)ctx->state[0];
  output[4] = *(uchar *)((long)ctx->state + 7);
  output[5] = *(uchar *)((long)ctx->state + 6);
  output[6] = *(uchar *)((long)ctx->state + 5);
  output[7] = (uchar)ctx->state[1];
  output[8] = *(uchar *)((long)ctx->state + 0xb);
  output[9] = *(uchar *)((long)ctx->state + 10);
  output[10] = *(uchar *)((long)ctx->state + 9);
  output[0xb] = (uchar)ctx->state[2];
  output[0xc] = *(uchar *)((long)ctx->state + 0xf);
  output[0xd] = *(uchar *)((long)ctx->state + 0xe);
  output[0xe] = *(uchar *)((long)ctx->state + 0xd);
  output[0xf] = (uchar)ctx->state[3];
  output[0x10] = *(uchar *)((long)ctx->state + 0x13);
  output[0x11] = *(uchar *)((long)ctx->state + 0x12);
  output[0x12] = *(uchar *)((long)ctx->state + 0x11);
  output[0x13] = (uchar)ctx->state[4];
  return 0;
}

Assistant:

int mbedtls_sha1_finish_ret( mbedtls_sha1_context *ctx,
                             unsigned char output[20] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;

    SHA1_VALIDATE_RET( ctx != NULL );
    SHA1_VALIDATE_RET( (unsigned char *)output != NULL );

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if( used <= 56 )
    {
        /* Enough room for padding + length in current block */
        memset( ctx->buffer + used, 0, 56 - used );
    }
    else
    {
        /* We'll need an extra block */
        memset( ctx->buffer + used, 0, 64 - used );

        if( ( ret = mbedtls_internal_sha1_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        memset( ctx->buffer, 0, 56 );
    }

    /*
     * Add message length
     */
    high = ( ctx->total[0] >> 29 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT32_BE( high, ctx->buffer, 56 );
    PUT_UINT32_BE( low,  ctx->buffer, 60 );

    if( ( ret = mbedtls_internal_sha1_process( ctx, ctx->buffer ) ) != 0 )
        return( ret );

    /*
     * Output final state
     */
    PUT_UINT32_BE( ctx->state[0], output,  0 );
    PUT_UINT32_BE( ctx->state[1], output,  4 );
    PUT_UINT32_BE( ctx->state[2], output,  8 );
    PUT_UINT32_BE( ctx->state[3], output, 12 );
    PUT_UINT32_BE( ctx->state[4], output, 16 );

    return( 0 );
}